

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepro_prod.h
# Opt level: O1

FlatExpr * __thiscall
mp::
PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>
::CombineOrderedFactors
          (FlatExpr *__return_storage_ptr__,
          PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>
          *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *pPVar3;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
  *this_00;
  int iVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  Arguments args_forall;
  int binvar;
  vector<int,_std::allocator<int>_> local_2a8;
  double local_288;
  ulong uStack_280;
  vector<int,_std::allocator<int>_> local_278;
  SmallVec<int,_6> *local_260;
  SmallVec<int,_6> *local_258;
  SmallVec<double,_6> *local_250;
  QuadTerms *local_248;
  SmallVec<int,_6> *local_240;
  CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::AndId>
  local_238;
  QuadraticExpr local_1f0;
  
  *(size_ty *)
   ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.coefs_
           .super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long> + 8) = 6;
  *(inline_storage<double,_6U> **)
   &(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long> =
       &(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.coefs_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage;
  uVar8 = 0;
  *(size_ty *)
   ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.coefs_
           .super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long> + 0x10) = 0;
  *(size_ty *)
   ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.vars_.
           super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long> + 8) = 6;
  (__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.vars_.
  super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.
             vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
  *(size_ty *)
   ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.vars_.
           super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long> + 0x10) = 0;
  *(size_ty *)
   ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
           folded_.
           super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
           m_data.
           super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long> + 8
   ) = 8;
  (__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.folded_.
  super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
  super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
             folded_.
             super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
             m_data.m_storage;
  *(size_ty *)
   ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
           folded_.
           super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
           m_data.
           super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long> +
   0x10) = 0;
  *(size_ty *)
   ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
           coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long> + 8) = 6;
  (__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
  super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
             coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage;
  *(size_ty *)
   ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
           coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long> + 0x10) = 0;
  *(size_ty *)
   ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
           vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long> + 8) = 6;
  (__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
  super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
             vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
  *(size_ty *)
   ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
           vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long> + 0x10) = 0;
  *(size_ty *)
   ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
           vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long> + 8) = 6;
  (__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
  super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
             vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
  *(size_ty *)
   ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
           vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long> + 0x10) = 0;
  (__return_storage_ptr__->super_QuadraticExpr).constant_term_ = 1.0;
  uVar7 = this->n_terms_const_;
  if ((long)(int)uVar7 < 1) {
    local_288 = 1.0;
  }
  else {
    local_288 = 1.0;
    lVar6 = 0;
    do {
      local_288 = local_288 *
                  *(double *)
                   ((long)&(((this->terms_flt_).
                             super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
                             .m_data.
                             super_small_vector_data_base<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_*,_unsigned_long>
                            .m_data_ptr)->
                           super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>
                           ).super__Tuple_impl<1UL,_mp::EExpr,_std::pair<double,_double>_>.
                           super__Head_base<1UL,_mp::EExpr,_false> + lVar6 + 0xfffffffffffffff0U);
      lVar6 = lVar6 + 0x1e0;
    } while ((long)(int)uVar7 * 0x1e0 - lVar6 != 0);
    uVar8 = (ulong)uVar7;
  }
  uStack_280 = 0;
  uVar7 = (uint)uVar8;
  local_240 = &(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.
               vars_;
  local_248 = &(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms;
  local_250 = &(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
               coefs_aux_;
  local_258 = &(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
               vars1_aux_;
  local_260 = &(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
               vars2_aux_;
  iVar4 = this->n_terms_binary_;
  if ((((long)iVar4 == 2) &&
      (((this->flt_->
        super_ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
        ).prepro_products_ & 2) != 0)) ||
     ((2 < iVar4 &&
      (((this->flt_->
        super_ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
        ).prepro_products_ & 4) != 0)))) {
    local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (int *)0x0;
    local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    std::vector<int,_std::allocator<int>_>::reserve(&local_2a8,(long)iVar4);
    if ((int)uVar7 < this->n_terms_binary_ + this->n_terms_const_) {
      uVar5 = uVar8 * 0x1e0 | 0x10;
      do {
        iVar4 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                ::Convert2Var(&(this->flt_->
                               super_ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                               ).flat_cvt_.
                               super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                              ,(QuadraticExpr *)
                               ((long)&(((this->terms_flt_).
                                         super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
                                         .m_data.
                                         super_small_vector_data_base<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_*,_unsigned_long>
                                        .m_data_ptr)->
                                       super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>
                                       ).
                                       super__Tuple_impl<1UL,_mp::EExpr,_std::pair<double,_double>_>
                                       .super__Head_base<1UL,_mp::EExpr,_false> +
                               uVar5 + 0xfffffffffffffff0));
        local_238.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p._0_4_ =
             iVar4;
        dVar2 = *(double *)
                 ((long)&(((this->terms_flt_).
                           super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
                           .m_data.
                           super_small_vector_data_base<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_*,_unsigned_long>
                          .m_data_ptr)->
                         super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>
                         ).super__Tuple_impl<1UL,_mp::EExpr,_std::pair<double,_double>_>.
                         super__Head_base<1UL,_mp::EExpr,_false> + uVar5 + 0xffffffffffffffe0);
        if ((dVar2 == -1.0) && (!NAN(dVar2))) {
          pPVar3 = this->flt_;
          EExpr::EExpr((EExpr *)&local_1f0,-1.0,iVar4);
          iVar4 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                  ::Convert2Var(&(pPVar3->
                                 super_ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                                 ).flat_cvt_.
                                 super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                                ,&local_1f0);
          local_238.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p._0_4_ =
               iVar4;
          if (6 < local_1f0.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                  super_small_vector_base<std::allocator<int>,_6U>.m_data.
                  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
            operator_delete(local_1f0.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                            super_small_vector_base<std::allocator<int>,_6U>.m_data.
                            super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                            local_1f0.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                            super_small_vector_base<std::allocator<int>,_6U>.m_data.
                            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
          }
          if (6 < local_1f0.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                  super_small_vector_base<std::allocator<int>,_6U>.m_data.
                  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
            operator_delete(local_1f0.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                            super_small_vector_base<std::allocator<int>,_6U>.m_data.
                            super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                            local_1f0.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                            super_small_vector_base<std::allocator<int>,_6U>.m_data.
                            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
          }
          if (6 < local_1f0.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                  super_small_vector_base<std::allocator<double>,_6U>.m_data.
                  super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
            operator_delete(local_1f0.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                            super_small_vector_base<std::allocator<double>,_6U>.m_data.
                            super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                            local_1f0.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                            super_small_vector_base<std::allocator<double>,_6U>.m_data.
                            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
          }
          if (8 < local_1f0.super_QuadAndLinTerms.super_QuadTerms.folded_.
                  super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                  .m_data.
                  super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                  .m_capacity) {
            operator_delete(local_1f0.super_QuadAndLinTerms.super_QuadTerms.folded_.
                            super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                            .m_data.
                            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                            .m_data_ptr,
                            local_1f0.super_QuadAndLinTerms.super_QuadTerms.folded_.
                            super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                            .m_data.
                            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                            .m_capacity << 4);
          }
          if (6 < local_1f0.super_QuadAndLinTerms.super_LinTerms.vars_.
                  super_small_vector_base<std::allocator<int>,_6U>.m_data.
                  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
            operator_delete(local_1f0.super_QuadAndLinTerms.super_LinTerms.vars_.
                            super_small_vector_base<std::allocator<int>,_6U>.m_data.
                            super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                            local_1f0.super_QuadAndLinTerms.super_LinTerms.vars_.
                            super_small_vector_base<std::allocator<int>,_6U>.m_data.
                            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
          }
          if (6 < local_1f0.super_QuadAndLinTerms.super_LinTerms.coefs_.
                  super_small_vector_base<std::allocator<double>,_6U>.m_data.
                  super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
            operator_delete(local_1f0.super_QuadAndLinTerms.super_LinTerms.coefs_.
                            super_small_vector_base<std::allocator<double>,_6U>.m_data.
                            super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                            local_1f0.super_QuadAndLinTerms.super_LinTerms.coefs_.
                            super_small_vector_base<std::allocator<double>,_6U>.m_data.
                            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
          }
          local_288 = -local_288;
          uStack_280 = uStack_280 ^ 0x8000000000000000;
        }
        if (local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_2a8,
                     (iterator)
                     local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_238);
        }
        else {
          *local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = (int)local_238.super_FunctionalConstraint.super_BasicConstraint.name_.
                            _M_dataplus._M_p;
          local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        uVar5 = uVar5 + 0x1e0;
        uVar7 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar7;
      } while ((int)uVar7 < this->n_terms_binary_ + this->n_terms_const_);
    }
    this_00 = (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
               *)this->flt_;
    std::vector<int,_std::allocator<int>_>::vector(&local_278,&local_2a8);
    local_238.
    super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AndId>
    .args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_238.
    super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AndId>
    .args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    local_238.
    super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AndId>
    .args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
    paVar1 = &local_238.super_FunctionalConstraint.super_BasicConstraint.name_.field_2;
    local_238.super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length = 0;
    local_238.super_FunctionalConstraint.super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
    local_238.super_FunctionalConstraint.result_var_ = -1;
    local_238.super_FunctionalConstraint.ctx.value_ = CTX_NONE;
    local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_238.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
         (pointer)paVar1;
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
    ::
    AssignResult2Args<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::AndId>>
              ((EExpr *)&local_1f0,this_00,&local_238);
    if (&local_1f0 != &__return_storage_ptr__->super_QuadraticExpr) {
      gch::detail::small_vector_base<std::allocator<double>,_6U>::move_assign_default<6U,_nullptr>
                ((small_vector_base<std::allocator<double>,_6U> *)__return_storage_ptr__,
                 (small_vector_base<std::allocator<double>,_6U> *)&local_1f0);
      gch::detail::small_vector_base<std::allocator<int>,_6U>::move_assign_default<6U,_nullptr>
                (&local_240->super_small_vector_base<std::allocator<int>,_6U>,
                 &local_1f0.super_QuadAndLinTerms.super_LinTerms.vars_.
                  super_small_vector_base<std::allocator<int>,_6U>);
      gch::detail::small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::
      move_assign_default<8U,_nullptr>
                ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
                 local_248,
                 (small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
                 &local_1f0.super_QuadAndLinTerms.super_QuadTerms);
      gch::detail::small_vector_base<std::allocator<double>,_6U>::move_assign_default<6U,_nullptr>
                (&local_250->super_small_vector_base<std::allocator<double>,_6U>,
                 &local_1f0.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                  super_small_vector_base<std::allocator<double>,_6U>);
      gch::detail::small_vector_base<std::allocator<int>,_6U>::move_assign_default<6U,_nullptr>
                (&local_258->super_small_vector_base<std::allocator<int>,_6U>,
                 &local_1f0.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                  super_small_vector_base<std::allocator<int>,_6U>);
      gch::detail::small_vector_base<std::allocator<int>,_6U>::move_assign_default<6U,_nullptr>
                (&local_260->super_small_vector_base<std::allocator<int>,_6U>,
                 &local_1f0.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                  super_small_vector_base<std::allocator<int>,_6U>);
    }
    (__return_storage_ptr__->super_QuadraticExpr).constant_term_ = local_1f0.constant_term_;
    if (6 < local_1f0.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1f0.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_1f0.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_1f0.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1f0.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_1f0.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_1f0.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1f0.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_1f0.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (8 < local_1f0.super_QuadAndLinTerms.super_QuadTerms.folded_.
            super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
            m_data.
            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
            m_capacity) {
      operator_delete(local_1f0.super_QuadAndLinTerms.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_data_ptr,
                      local_1f0.super_QuadAndLinTerms.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_capacity << 4);
    }
    if (6 < local_1f0.super_QuadAndLinTerms.super_LinTerms.vars_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1f0.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_1f0.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_1f0.super_QuadAndLinTerms.super_LinTerms.coefs_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1f0.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_1f0.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (local_238.
        super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AndId>
        .args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_238.
                      super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AndId>
                      .args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_238.
                            super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AndId>
                            .args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_238.
                            super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AndId>
                            .args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p !=
        paVar1) {
      operator_delete(local_238.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus.
                      _M_p,CONCAT71(local_238.super_FunctionalConstraint.super_BasicConstraint.name_
                                    .field_2._M_allocated_capacity._1_7_,
                                    local_238.super_FunctionalConstraint.super_BasicConstraint.name_
                                    .field_2._M_local_buf[0]) + 1);
    }
    if (local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  QuadAndLinTerms::operator*=((QuadAndLinTerms *)__return_storage_ptr__,local_288);
  (__return_storage_ptr__->super_QuadraticExpr).constant_term_ =
       local_288 * (__return_storage_ptr__->super_QuadraticExpr).constant_term_;
  if ((int)uVar7 <
      (int)(this->terms_flt_).
           super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
           .m_data.
           super_small_vector_data_base<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_*,_unsigned_long>
           .m_size) {
    lVar6 = (long)(int)uVar7;
    uVar8 = lVar6 * 0x1e0 | 0x10;
    do {
      ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
      ::QuadratizeOrLinearize
                ((EExpr *)&local_1f0,
                 &this->flt_->
                  super_ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 ,__return_storage_ptr__,
                 (EExpr *)((long)&(((this->terms_flt_).
                                    super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
                                    .m_data.
                                    super_small_vector_data_base<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_*,_unsigned_long>
                                   .m_data_ptr)->
                                  super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>
                                  ).super__Tuple_impl<1UL,_mp::EExpr,_std::pair<double,_double>_>.
                                  super__Head_base<1UL,_mp::EExpr,_false> +
                          uVar8 + 0xfffffffffffffff0));
      if (&local_1f0 != &__return_storage_ptr__->super_QuadraticExpr) {
        gch::detail::small_vector_base<std::allocator<double>,_6U>::move_assign_default<6U,_nullptr>
                  ((small_vector_base<std::allocator<double>,_6U> *)__return_storage_ptr__,
                   (small_vector_base<std::allocator<double>,_6U> *)&local_1f0);
        gch::detail::small_vector_base<std::allocator<int>,_6U>::move_assign_default<6U,_nullptr>
                  (&local_240->super_small_vector_base<std::allocator<int>,_6U>,
                   &local_1f0.super_QuadAndLinTerms.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>);
        gch::detail::small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
        ::move_assign_default<8U,_nullptr>
                  ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *
                   )local_248,
                   (small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *
                   )&local_1f0.super_QuadAndLinTerms.super_QuadTerms);
        gch::detail::small_vector_base<std::allocator<double>,_6U>::move_assign_default<6U,_nullptr>
                  (&local_250->super_small_vector_base<std::allocator<double>,_6U>,
                   &local_1f0.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                    super_small_vector_base<std::allocator<double>,_6U>);
        gch::detail::small_vector_base<std::allocator<int>,_6U>::move_assign_default<6U,_nullptr>
                  (&local_258->super_small_vector_base<std::allocator<int>,_6U>,
                   &local_1f0.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>);
        gch::detail::small_vector_base<std::allocator<int>,_6U>::move_assign_default<6U,_nullptr>
                  (&local_260->super_small_vector_base<std::allocator<int>,_6U>,
                   &local_1f0.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>);
      }
      (__return_storage_ptr__->super_QuadraticExpr).constant_term_ = local_1f0.constant_term_;
      if (6 < local_1f0.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
              super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_1f0.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_1f0.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_1f0.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
              super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_1f0.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_1f0.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_1f0.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
              super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_1f0.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_1f0.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
      }
      if (8 < local_1f0.super_QuadAndLinTerms.super_QuadTerms.folded_.
              super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
              m_data.
              super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
              m_capacity) {
        operator_delete(local_1f0.super_QuadAndLinTerms.super_QuadTerms.folded_.
                        super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                        .m_data.
                        super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                        .m_data_ptr,
                        local_1f0.super_QuadAndLinTerms.super_QuadTerms.folded_.
                        super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                        .m_data.
                        super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                        .m_capacity << 4);
      }
      if (6 < local_1f0.super_QuadAndLinTerms.super_LinTerms.vars_.
              super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_1f0.super_QuadAndLinTerms.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_1f0.super_QuadAndLinTerms.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_1f0.super_QuadAndLinTerms.super_LinTerms.coefs_.
              super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_1f0.super_QuadAndLinTerms.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_1f0.super_QuadAndLinTerms.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
      }
      lVar6 = lVar6 + 1;
      uVar8 = uVar8 + 0x1e0;
    } while (lVar6 < (int)(this->terms_flt_).
                          super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
                          .m_data.
                          super_small_vector_data_base<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_*,_unsigned_long>
                          .m_size);
  }
  return __return_storage_ptr__;
}

Assistant:

FlatExpr CombineOrderedFactors() {
    FlatExpr result = typename FlatExpr::Constant {1.0};
    int i=0;
    double coef00 = 1.0;

    for ( ; i<n_terms_const_; ++i) {      // Collect constant factors
      // no: can have constant args
      // assert(std::get<1>(terms_flt_[i]).is_constant());
      auto bnds = std::get<2>(terms_flt_[i]);
      assert(bnds.first == bnds.second);
      coef00 *= bnds.first;
    }

    if ((n_terms_binary_==2 && GetFlt().prepro_products()&2) ||
        (n_terms_binary_>=3 && GetFlt().prepro_products()&4)) {
      AndConstraint::Arguments args_forall;
      args_forall.reserve(n_terms_binary_);   // Logicalize binary product
      for ( ; i<n_terms_const_+n_terms_binary_; ++i) {
        assert(1.0 ==                 // term bounds range 1
               std::get<2>(terms_flt_[i]).second -
                   std::get<2>(terms_flt_[i]).first );
        int binvar = GetFlt().Convert2Var(std::move(std::get<1>(terms_flt_[i])));
        auto is_lb_minus1 = (-1.0 == std::get<2>(terms_flt_[i]).first);
        if (is_lb_minus1) {    // negated binary
          coef00 *= -1;
          binvar = GetFlt().Convert2Var( { {-1.0}, {binvar} } );
        } else {
          assert(0.0 == std::get<2>(terms_flt_[i]).first); // normal binary
        }
        args_forall.push_back( binvar );
      }
      result = GetFlt().AssignResult2Args( AndConstraint{args_forall} );
      // Context should be set when adding the top contraint
    }

    result *= coef00;

    for ( ; i<(int)terms_flt_.size(); ++i) {
      result = GetFlt().QuadratizeOrLinearize(
          result, std::get<1>(terms_flt_[i]));
    }

    return result;
  }